

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camera.cpp
# Opt level: O2

mat4 * __thiscall lumeview::Camera::view_matrix(mat4 *__return_storage_ptr__,Camera *this)

{
  tvec3<float,_(glm::precision)0> *in_R8;
  anon_union_12_3_e2189aaa_for_tvec3<float,_(glm::precision)0>_2 local_50;
  anon_union_12_3_e2189aaa_for_tvec3<float,_(glm::precision)0>_2 local_40;
  anon_union_12_3_e2189aaa_for_tvec3<float,_(glm::precision)0>_2 local_30;
  
  local_30.field_0 =
       (anon_struct_12_3_4e92e0dd_for_anon_union_12_3_e2189aaa_for_tvec3<float,_(glm::precision)0>_2_0
        )from(this);
  local_40._0_8_ = *(undefined8 *)&(this->m_trans).field_0;
  local_40.field_0.z = (this->m_trans).field_0.field_0.z;
  local_50.field_0 =
       (anon_struct_12_3_4e92e0dd_for_anon_union_12_3_e2189aaa_for_tvec3<float,_(glm::precision)0>_2_0
        )up(this);
  glm::lookAtRH<float,(glm::precision)0>
            (__return_storage_ptr__,(glm *)&local_30.field_0,
             (tvec3<float,_(glm::precision)0> *)&local_40.field_0,
             (tvec3<float,_(glm::precision)0> *)&local_50.field_0,in_R8);
  return __return_storage_ptr__;
}

Assistant:

glm::mat4 Camera::
view_matrix () const
{
	return glm::lookAt (from(), to(), up());
}